

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scd_pcm.c
# Opt level: O0

void SCD_PCM_Write_Reg(void *info,UINT8 Reg,UINT8 Data)

{
  byte *pbVar1;
  long lVar2;
  pcm_chan_ *chan;
  int i;
  pcm_chip_ *chip;
  UINT8 Data_local;
  UINT8 Reg_local;
  void *info_local;
  
  pbVar1 = (byte *)((long)info + (ulong)*(byte *)((long)info + 0xe) * 0x1c + 0x14);
  switch(Reg) {
  case '\0':
    *pbVar1 = Data;
    *(short *)(pbVar1 + 2) = (short)((int)((uint)Data * (pbVar1[1] & 0xf)) >> 5);
    *(short *)(pbVar1 + 4) = (short)((int)((uint)Data * ((int)(uint)pbVar1[1] >> 4)) >> 5);
    break;
  case '\x01':
    pbVar1[1] = Data;
    *(short *)(pbVar1 + 2) = (short)((int)((Data & 0xf) * (uint)*pbVar1) >> 5);
    *(short *)(pbVar1 + 4) = (short)((int)(((int)(uint)Data >> 4) * (uint)*pbVar1) >> 5);
    break;
  case '\x02':
    *(ushort *)(pbVar1 + 0x14) = (ushort)pbVar1[0x15] << 8;
    *(ushort *)(pbVar1 + 0x14) = (ushort)*(undefined4 *)(pbVar1 + 0x14) | (ushort)Data;
    *(int *)(pbVar1 + 0x10) =
         (int)(long)((float)*(ushort *)(pbVar1 + 0x14) * *(float *)((long)info + 8));
    break;
  case '\x03':
    *(ushort *)(pbVar1 + 0x14) = (ushort)pbVar1[0x14];
    *(ushort *)(pbVar1 + 0x14) = (ushort)*(undefined4 *)(pbVar1 + 0x14) | (ushort)Data << 8;
    *(int *)(pbVar1 + 0x10) =
         (int)(long)((float)*(ushort *)(pbVar1 + 0x14) * *(float *)((long)info + 8));
    break;
  case '\x04':
    *(ushort *)(pbVar1 + 8) = *(ushort *)(pbVar1 + 8) & 0xff00;
    *(ushort *)(pbVar1 + 8) = *(ushort *)(pbVar1 + 8) | (ushort)Data;
    break;
  case '\x05':
    *(ushort *)(pbVar1 + 8) = *(ushort *)(pbVar1 + 8) & 0xff;
    *(ushort *)(pbVar1 + 8) = *(ushort *)(pbVar1 + 8) | (ushort)Data << 8;
    break;
  case '\x06':
    *(ushort *)(pbVar1 + 6) = (ushort)Data << 8;
    break;
  case '\a':
    if ((Data & 0x40) == 0) {
      *(ushort *)((long)info + 0x10) = (ushort)Data << 0xc;
    }
    else {
      *(byte *)((long)info + 0xe) = Data & 7;
    }
    if ((Data & 0x80) == 0) {
      *(undefined1 *)((long)info + 0xd) = 0;
    }
    else {
      *(undefined1 *)((long)info + 0xd) = 0xff;
    }
    break;
  case '\b':
    for (chan._4_4_ = 0; chan._4_4_ < 8; chan._4_4_ = chan._4_4_ + 1) {
      lVar2 = (long)chan._4_4_ * 0x1c;
      if (*(char *)((long)info + lVar2 + 0x2a) == '\0') {
        *(uint *)((long)info + lVar2 + 0x20) = (uint)*(ushort *)((long)info + lVar2 + 0x1a) << 0xb;
      }
    }
    for (chan._4_4_ = 0; chan._4_4_ < 8; chan._4_4_ = chan._4_4_ + 1) {
      *(byte *)((long)info + (long)chan._4_4_ * 0x1c + 0x2a) =
           (Data ^ 0xff) & (byte)(1 << ((byte)chan._4_4_ & 0x1f));
    }
  }
  return;
}

Assistant:

static void SCD_PCM_Write_Reg(void* info, UINT8 Reg, UINT8 Data)
{
	struct pcm_chip_ *chip = (struct pcm_chip_ *)info;
	int i;
	struct pcm_chan_* chan = &chip->Channel[chip->Cur_Chan];
	
	switch (Reg)
	{
		case 0x00:
			/* evelope register */
			chan->ENV = Data;
			chan->MUL_L = (Data * (chan->PAN & 0x0F)) >> 5;
			chan->MUL_R = (Data * (chan->PAN >> 4)) >> 5;
		break;
		
		case 0x01:
			/* pan register */
			chan->PAN = Data;
			chan->MUL_L = ((Data & 0x0F) * chan->ENV) >> 5;
			chan->MUL_R = ((Data >> 4) * chan->ENV) >> 5;
			break;
		
		case 0x02:
			/* frequency step (LB) registers */
			chan->Step_B &= 0xFF00;
			chan->Step_B |= Data;
			chan->Step = (UINT32)((float)chan->Step_B * chip->Rate);
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Step low = %.2X   Step calculated = %.8X",
			//	Data, chan->Step);
			break;
		
		case 0x03:
			/* frequency step (HB) registers */
			chan->Step_B &= 0x00FF;
			chan->Step_B |= Data << 8;
			chan->Step = (UINT32)((float)chan->Step_B * chip->Rate);
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Step high = %.2X   Step calculated = %.8X",
			//	Data, chan->Step);
			break;
		
		case 0x04:
			chan->Loop_Addr &= 0xFF00;
			chan->Loop_Addr |= Data;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Loop low = %.2X   Loop = %.8X",
			//	Data, chan->Loop_Addr);
			break;
		
		case 0x05:
			/* loop address registers */
			chan->Loop_Addr &= 0x00FF;
			chan->Loop_Addr |= Data << 8;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Loop high = %.2X   Loop = %.8X",
			//	Data, chan->Loop_Addr);
			break;
		
		case 0x06:
			/* start address registers */
			chan->St_Addr = Data << 8;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Start addr = %.2X   New Addr = %.8X",
			//	Data, chan->Addr);
			break;
		
		case 0x07:
			/* control register */
			/* mod is H */
			if (Data & 0x40)
			{
				/* select channel */
				chip->Cur_Chan = Data & 0x07;
			}
			/* mod is L */
			else
			{
				/* pcm ram bank select */
				chip->Bank = (Data & 0x0F) << 12;
			}
			
			/* sounding bit */
			if (Data & 0x80)
				chip->Enable = 0xFF;	// Used as mask
			else
				chip->Enable = 0;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"General Enable = %.2X", Data);
			break;
		
		case 0x08:
			/* sound on/off register */
			Data = ~Data;
			
			//LOG_MSG(pcm, LOG_MSG_LEVEL_DEBUG1,
			//	"Channel Enable = %.2X", Data);
			
			for (i = 0; i < 8; i++)
			{
				chan = &chip->Channel[i];
				if (!chan->Enable)
					chan->Addr = chan->St_Addr << PCM_STEP_SHIFT;
			}
			
			for (i = 0; i < 8; i++)
			{
				chip->Channel[i].Enable = Data & (1 << i);
			}
	}
}